

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

void nifti_swap_Nbytes(size_t n,int siz,void *ar)

{
  void *ar_local;
  int siz_local;
  size_t n_local;
  
  switch(siz) {
  case 2:
    nifti_swap_2bytes(n,ar);
    break;
  default:
    fprintf(_stderr,"** NIfTI: cannot swap in %d byte blocks\n",(ulong)(uint)siz);
    break;
  case 4:
    nifti_swap_4bytes(n,ar);
    break;
  case 8:
    nifti_swap_8bytes(n,ar);
    break;
  case 0x10:
    nifti_swap_16bytes(n,ar);
  }
  return;
}

Assistant:

void nifti_swap_Nbytes( size_t n , int siz , void *ar )  /* subsuming case */
{
   switch( siz ){
     case 2:  nifti_swap_2bytes ( n , ar ) ; break ;
     case 4:  nifti_swap_4bytes ( n , ar ) ; break ;
     case 8:  nifti_swap_8bytes ( n , ar ) ; break ;
     case 16: nifti_swap_16bytes( n , ar ) ; break ;
     default:    /* nifti_swap_bytes  ( n , siz, ar ) ; */
        fprintf(stderr,"** NIfTI: cannot swap in %d byte blocks\n", siz);
        break ;
   }
   return ;
}